

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureTestUtil.hpp
# Opt level: O2

TestInstance * __thiscall
vkt::texture::util::
TextureTestCase<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance>::createInstance
          (TextureTestCase<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance> *this
          ,Context *context)

{
  Context **this_00;
  float ref_;
  TestInstance *this_01;
  TestInstance *pTVar1;
  TestTextureCube *this_02;
  ulong uVar2;
  Context *texture;
  int levelNdx;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  bool bVar7;
  float local_150;
  Vec4 local_138;
  Vec2 local_128 [2];
  uint local_118;
  int local_114;
  RGBA local_110;
  RGBA local_10c;
  TestInstance *local_108;
  TextureRenderer *local_100;
  PixelBufferAccess local_f8;
  Vector<float,_4> local_d0;
  Vec4 cScale;
  Vec4 cBias;
  Vec4 local_a0;
  Vector<float,_4> local_90;
  Vector<float,_4> local_80;
  TextureFormatInfo fmtInfo;
  
  pTVar1 = (TestInstance *)operator_new(0x288);
  pTVar1->m_context = context;
  pTVar1->_vptr_TestInstance = (_func_int **)&PTR__TextureCubeShadowTestInstance_00bdf170;
  pTVar1[1]._vptr_TestInstance = (_func_int **)&this->m_testsParameters;
  this_00 = &pTVar1[1].m_context;
  local_108 = pTVar1 + 3;
  local_100 = (TextureRenderer *)&pTVar1[4].m_context;
  pTVar1[1].m_context = (Context *)0x0;
  pTVar1[2]._vptr_TestInstance = (_func_int **)0x0;
  pTVar1[2].m_context = (Context *)0x0;
  pTVar1[3]._vptr_TestInstance = (_func_int **)0x0;
  pTVar1[3].m_context = (Context *)0x0;
  pTVar1[4]._vptr_TestInstance = (_func_int **)0x0;
  TextureRenderer::TextureRenderer
            (local_100,context,
             (this->m_testsParameters).super_TextureCubeTestCaseParameters.
             super_TextureCommonTestCaseParameters.sampleCount,0x1c,0x1c);
  *(undefined4 *)&pTVar1[0x28]._vptr_TestInstance = 0;
  uVar5 = *(uint *)(pTVar1[1]._vptr_TestInstance + 8);
  if (uVar5 == 0) {
    uVar3 = 0x20;
  }
  else {
    uVar3 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    uVar3 = uVar3 ^ 0x1f;
  }
  local_f8.super_ConstPixelBufferAccess.m_format =
       ::vk::mapVkFormat(*(VkFormat *)(pTVar1[1]._vptr_TestInstance + 4));
  tcu::getTextureFormatInfo(&fmtInfo,(TextureFormat *)&local_f8);
  tcu::Vector<float,_4>::Vector(&cBias,&fmtInfo.valueMin);
  tcu::operator-((tcu *)&cScale,&fmtInfo.valueMax,&fmtInfo.valueMin);
  std::
  vector<de::SharedPtr<vkt::pipeline::TestTextureCube>,_std::allocator<de::SharedPtr<vkt::pipeline::TestTextureCube>_>_>
  ::reserve((vector<de::SharedPtr<vkt::pipeline::TestTextureCube>,_std::allocator<de::SharedPtr<vkt::pipeline::TestTextureCube>_>_>
             *)this_00,2);
  iVar4 = 2;
  while (bVar7 = iVar4 != 0, iVar4 = iVar4 + -1, bVar7) {
    this_02 = (TestTextureCube *)operator_new(0x188);
    local_138.m_data._0_8_ = ::vk::mapVkFormat(*(VkFormat *)(pTVar1[1]._vptr_TestInstance + 4));
    vkt::pipeline::TestTextureCube::TestTextureCube
              (this_02,(TextureFormat *)&local_138,*(int *)(pTVar1[1]._vptr_TestInstance + 8));
    de::SharedPtr<vkt::pipeline::TestTextureCube>::SharedPtr
              ((SharedPtr<vkt::pipeline::TestTextureCube> *)&local_f8,this_02);
    std::
    vector<de::SharedPtr<vkt::pipeline::TestTextureCube>,std::allocator<de::SharedPtr<vkt::pipeline::TestTextureCube>>>
    ::emplace_back<de::SharedPtr<vkt::pipeline::TestTextureCube>>
              ((vector<de::SharedPtr<vkt::pipeline::TestTextureCube>,std::allocator<de::SharedPtr<vkt::pipeline::TestTextureCube>>>
                *)this_00,(SharedPtr<vkt::pipeline::TestTextureCube> *)&local_f8);
    de::SharedPtr<vkt::pipeline::TestTextureCube>::release
              ((SharedPtr<vkt::pipeline::TestTextureCube> *)&local_f8);
  }
  if (texture::(anonymous_namespace)::TextureCubeShadowTestInstance::
      TextureCubeShadowTestInstance(vkt::Context&,vkt::texture::(anonymous_namespace)::TextureCubeShadowTestCaseParameters_const&)
      ::gradients == '\0') {
    iVar4 = __cxa_guard_acquire(&texture::(anonymous_namespace)::TextureCubeShadowTestInstance::
                                 TextureCubeShadowTestInstance(vkt::Context&,vkt::texture::(anonymous_namespace)::TextureCubeShadowTestCaseParameters_const&)
                                 ::gradients);
    if (iVar4 != 0) {
      texture::(anonymous_namespace)::TextureCubeShadowTestInstance::
      TextureCubeShadowTestInstance(vkt::Context&,vkt::texture::(anonymous_namespace)::TextureCubeShadowTestCaseParameters_const&)
      ::gradients._0_8_ = 0xbf800000bf800000;
      texture::(anonymous_namespace)::TextureCubeShadowTestInstance::
      TextureCubeShadowTestInstance(vkt::Context&,vkt::texture::(anonymous_namespace)::TextureCubeShadowTestCaseParameters_const&)
      ::gradients._8_8_ = 0x40000000bf800000;
      texture::(anonymous_namespace)::TextureCubeShadowTestInstance::
      TextureCubeShadowTestInstance(vkt::Context&,vkt::texture::(anonymous_namespace)::TextureCubeShadowTestCaseParameters_const&)
      ::gradients._16_4_ = 0x3f800000;
      texture::(anonymous_namespace)::TextureCubeShadowTestInstance::
      TextureCubeShadowTestInstance(vkt::Context&,vkt::texture::(anonymous_namespace)::TextureCubeShadowTestCaseParameters_const&)
      ::gradients._20_4_ = 0x3f800000;
      texture::(anonymous_namespace)::TextureCubeShadowTestInstance::
      TextureCubeShadowTestInstance(vkt::Context&,vkt::texture::(anonymous_namespace)::TextureCubeShadowTestCaseParameters_const&)
      ::gradients._24_4_ = 0x3f800000;
      texture::(anonymous_namespace)::TextureCubeShadowTestInstance::
      TextureCubeShadowTestInstance(vkt::Context&,vkt::texture::(anonymous_namespace)::TextureCubeShadowTestCaseParameters_const&)
      ::gradients._28_4_ = 0;
      texture::(anonymous_namespace)::TextureCubeShadowTestInstance::
      TextureCubeShadowTestInstance(vkt::Context&,vkt::texture::(anonymous_namespace)::TextureCubeShadowTestCaseParameters_const&)
      ::gradients._32_8_ = 0xbf80000000000000;
      texture::(anonymous_namespace)::TextureCubeShadowTestInstance::
      TextureCubeShadowTestInstance(vkt::Context&,vkt::texture::(anonymous_namespace)::TextureCubeShadowTestCaseParameters_const&)
      ::gradients._40_8_ = 0x40000000bf800000;
      texture::(anonymous_namespace)::TextureCubeShadowTestInstance::
      TextureCubeShadowTestInstance(vkt::Context&,vkt::texture::(anonymous_namespace)::TextureCubeShadowTestCaseParameters_const&)
      ::gradients._48_4_ = 0x3f800000;
      texture::(anonymous_namespace)::TextureCubeShadowTestInstance::
      TextureCubeShadowTestInstance(vkt::Context&,vkt::texture::(anonymous_namespace)::TextureCubeShadowTestCaseParameters_const&)
      ::gradients._52_4_ = 0x3f800000;
      texture::(anonymous_namespace)::TextureCubeShadowTestInstance::
      TextureCubeShadowTestInstance(vkt::Context&,vkt::texture::(anonymous_namespace)::TextureCubeShadowTestCaseParameters_const&)
      ::gradients._56_4_ = 0x3f800000;
      texture::(anonymous_namespace)::TextureCubeShadowTestInstance::
      TextureCubeShadowTestInstance(vkt::Context&,vkt::texture::(anonymous_namespace)::TextureCubeShadowTestCaseParameters_const&)
      ::gradients._60_4_ = 0;
      texture::(anonymous_namespace)::TextureCubeShadowTestInstance::
      TextureCubeShadowTestInstance(vkt::Context&,vkt::texture::(anonymous_namespace)::TextureCubeShadowTestCaseParameters_const&)
      ::gradients._64_8_ = 0xbf800000;
      texture::(anonymous_namespace)::TextureCubeShadowTestInstance::
      TextureCubeShadowTestInstance(vkt::Context&,vkt::texture::(anonymous_namespace)::TextureCubeShadowTestCaseParameters_const&)
      ::gradients._72_8_ = 0x40000000bf800000;
      texture::(anonymous_namespace)::TextureCubeShadowTestInstance::
      TextureCubeShadowTestInstance(vkt::Context&,vkt::texture::(anonymous_namespace)::TextureCubeShadowTestCaseParameters_const&)
      ::gradients._80_4_ = 0x3f800000;
      texture::(anonymous_namespace)::TextureCubeShadowTestInstance::
      TextureCubeShadowTestInstance(vkt::Context&,vkt::texture::(anonymous_namespace)::TextureCubeShadowTestCaseParameters_const&)
      ::gradients._84_4_ = 0x3f800000;
      texture::(anonymous_namespace)::TextureCubeShadowTestInstance::
      TextureCubeShadowTestInstance(vkt::Context&,vkt::texture::(anonymous_namespace)::TextureCubeShadowTestCaseParameters_const&)
      ::gradients._88_4_ = 0x3f800000;
      texture::(anonymous_namespace)::TextureCubeShadowTestInstance::
      TextureCubeShadowTestInstance(vkt::Context&,vkt::texture::(anonymous_namespace)::TextureCubeShadowTestCaseParameters_const&)
      ::gradients._92_4_ = 0;
      texture::(anonymous_namespace)::TextureCubeShadowTestInstance::
      TextureCubeShadowTestInstance(vkt::Context&,vkt::texture::(anonymous_namespace)::TextureCubeShadowTestCaseParameters_const&)
      ::gradients._96_8_ = 0xbf800000bf800000;
      texture::(anonymous_namespace)::TextureCubeShadowTestInstance::
      TextureCubeShadowTestInstance(vkt::Context&,vkt::texture::(anonymous_namespace)::TextureCubeShadowTestCaseParameters_const&)
      ::gradients._104_8_ = 0x4000000000000000;
      texture::(anonymous_namespace)::TextureCubeShadowTestInstance::
      TextureCubeShadowTestInstance(vkt::Context&,vkt::texture::(anonymous_namespace)::TextureCubeShadowTestCaseParameters_const&)
      ::gradients._112_4_ = 0x3f800000;
      texture::(anonymous_namespace)::TextureCubeShadowTestInstance::
      TextureCubeShadowTestInstance(vkt::Context&,vkt::texture::(anonymous_namespace)::TextureCubeShadowTestCaseParameters_const&)
      ::gradients._116_4_ = 0x3f800000;
      texture::(anonymous_namespace)::TextureCubeShadowTestInstance::
      TextureCubeShadowTestInstance(vkt::Context&,vkt::texture::(anonymous_namespace)::TextureCubeShadowTestCaseParameters_const&)
      ::gradients._120_4_ = 0x3f800000;
      texture::(anonymous_namespace)::TextureCubeShadowTestInstance::
      TextureCubeShadowTestInstance(vkt::Context&,vkt::texture::(anonymous_namespace)::TextureCubeShadowTestCaseParameters_const&)
      ::gradients._124_4_ = 0;
      texture::(anonymous_namespace)::TextureCubeShadowTestInstance::
      TextureCubeShadowTestInstance(vkt::Context&,vkt::texture::(anonymous_namespace)::TextureCubeShadowTestCaseParameters_const&)
      ::gradients._128_8_ = 0xbf800000bf800000;
      texture::(anonymous_namespace)::TextureCubeShadowTestInstance::
      TextureCubeShadowTestInstance(vkt::Context&,vkt::texture::(anonymous_namespace)::TextureCubeShadowTestCaseParameters_const&)
      ::gradients._136_8_ = 0xbf800000;
      texture::(anonymous_namespace)::TextureCubeShadowTestInstance::
      TextureCubeShadowTestInstance(vkt::Context&,vkt::texture::(anonymous_namespace)::TextureCubeShadowTestCaseParameters_const&)
      ::gradients._144_8_ = &DAT_3f8000003f800000;
      texture::(anonymous_namespace)::TextureCubeShadowTestInstance::
      TextureCubeShadowTestInstance(vkt::Context&,vkt::texture::(anonymous_namespace)::TextureCubeShadowTestCaseParameters_const&)
      ::gradients._152_8_ = &DAT_3f8000003f800000;
      texture::(anonymous_namespace)::TextureCubeShadowTestInstance::
      TextureCubeShadowTestInstance(vkt::Context&,vkt::texture::(anonymous_namespace)::TextureCubeShadowTestCaseParameters_const&)
      ::gradients._160_4_ = 0;
      texture::(anonymous_namespace)::TextureCubeShadowTestInstance::
      TextureCubeShadowTestInstance(vkt::Context&,vkt::texture::(anonymous_namespace)::TextureCubeShadowTestCaseParameters_const&)
      ::gradients._164_4_ = 0;
      texture::(anonymous_namespace)::TextureCubeShadowTestInstance::
      TextureCubeShadowTestInstance(vkt::Context&,vkt::texture::(anonymous_namespace)::TextureCubeShadowTestCaseParameters_const&)
      ::gradients._168_4_ = 0;
      texture::(anonymous_namespace)::TextureCubeShadowTestInstance::
      TextureCubeShadowTestInstance(vkt::Context&,vkt::texture::(anonymous_namespace)::TextureCubeShadowTestCaseParameters_const&)
      ::gradients._172_4_ = 0x40000000;
      texture::(anonymous_namespace)::TextureCubeShadowTestInstance::
      TextureCubeShadowTestInstance(vkt::Context&,vkt::texture::(anonymous_namespace)::TextureCubeShadowTestCaseParameters_const&)
      ::gradients._176_4_ = 0x3f800000;
      texture::(anonymous_namespace)::TextureCubeShadowTestInstance::
      TextureCubeShadowTestInstance(vkt::Context&,vkt::texture::(anonymous_namespace)::TextureCubeShadowTestCaseParameters_const&)
      ::gradients._180_4_ = 0x3f800000;
      texture::(anonymous_namespace)::TextureCubeShadowTestInstance::
      TextureCubeShadowTestInstance(vkt::Context&,vkt::texture::(anonymous_namespace)::TextureCubeShadowTestCaseParameters_const&)
      ::gradients._184_4_ = 0x3f800000;
      texture::(anonymous_namespace)::TextureCubeShadowTestInstance::
      TextureCubeShadowTestInstance(vkt::Context&,vkt::texture::(anonymous_namespace)::TextureCubeShadowTestCaseParameters_const&)
      ::gradients._188_4_ = 0;
      __cxa_guard_release(&texture::(anonymous_namespace)::TextureCubeShadowTestInstance::
                           TextureCubeShadowTestInstance(vkt::Context&,vkt::texture::(anonymous_namespace)::TextureCubeShadowTestCaseParameters_const&)
                           ::gradients);
    }
  }
  for (uVar2 = 0; uVar2 != 6; uVar2 = uVar2 + 1) {
    for (iVar4 = 0; 0x20 - uVar3 != iVar4; iVar4 = iVar4 + 1) {
      (*(code *)(*this_00)->m_testCtx->m_platform[7]._vptr_Platform)
                (&local_f8,(*this_00)->m_testCtx,iVar4,uVar2 & 0xffffffff);
      tcu::operator*((tcu *)local_128,
                     (Vector<float,_4> *)
                     (texture::(anonymous_namespace)::TextureCubeShadowTestInstance::
                      TextureCubeShadowTestInstance(vkt::Context&,vkt::texture::(anonymous_namespace)::TextureCubeShadowTestCaseParameters_const&)
                      ::gradients + uVar2 * 0x20),&cScale);
      tcu::operator+((tcu *)&local_138,(Vector<float,_4> *)local_128,&cBias);
      tcu::operator*((tcu *)&local_d0,
                     (Vector<float,_4> *)
                     (texture::(anonymous_namespace)::TextureCubeShadowTestInstance::
                      TextureCubeShadowTestInstance(vkt::Context&,vkt::texture::(anonymous_namespace)::TextureCubeShadowTestCaseParameters_const&)
                      ::gradients + uVar2 * 0x20 + 0x10),&cScale);
      tcu::operator+((tcu *)&local_a0,&local_d0,&cBias);
      tcu::fillWithComponentGradients(&local_f8,&local_138,&local_a0);
    }
  }
  local_118 = (0x1f - uVar3) * 6 + 6;
  iVar4 = 0;
  while (iVar4 != 6) {
    iVar6 = 0;
    local_114 = iVar4;
    while( true ) {
      iVar4 = local_114;
      if (0x20 - uVar3 == iVar6) break;
      uVar2 = (ulong)local_118;
      (**(code **)(*(long *)&((*this_00)->m_progCollection->m_programs)._M_t._M_impl + 0x38))
                (&local_f8,(*this_00)->m_progCollection,iVar6,local_114);
      uVar5 = iVar6 * iVar4 * (int)(0xffffff / uVar2);
      local_10c.m_value = uVar5 | 0xff000000;
      tcu::RGBA::toVec(&local_10c);
      tcu::operator*((tcu *)local_128,&local_a0,&cScale);
      tcu::operator+((tcu *)&local_138,(Vector<float,_4> *)local_128,&cBias);
      local_110.m_value = ~uVar5 | 0xff000000;
      tcu::RGBA::toVec(&local_110);
      tcu::operator*((tcu *)&local_80,&local_90,&cScale);
      tcu::operator+((tcu *)&local_d0,&local_80,&cBias);
      tcu::fillWithGrid(&local_f8,4,&local_138,&local_d0);
      iVar6 = iVar6 + 1;
    }
    iVar4 = local_114 + 1;
  }
  for (texture = pTVar1[1].m_context; texture != (Context *)pTVar1[2]._vptr_TestInstance;
      texture = (Context *)&texture->m_progCollection) {
    TextureRenderer::addCubeTexture(local_100,(TestTextureCubeSp *)texture);
  }
  local_150 = 0.0;
  bVar7 = *(int *)pTVar1[1]._vptr_TestInstance - 5U < 2;
  ref_ = *(float *)(&DAT_009cbf60 + (ulong)bVar7 * 4);
  if (!bVar7) {
    local_150 = 0.5;
  }
  local_138.m_data[0] = -1.25;
  local_138.m_data[1] = -1.2;
  local_128[0].m_data[0] = 1.2;
  local_128[0].m_data[1] = 1.25;
  texture::anon_unknown_0::TextureCubeShadowTestInstance::FilterCase::FilterCase
            ((FilterCase *)&local_f8,0,ref_,(Vec2 *)&local_138,local_128);
  this_01 = local_108;
  std::
  vector<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase>_>
  ::push_back((vector<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase>_>
               *)local_108,(FilterCase *)&local_f8);
  local_138.m_data[0] = 0.8;
  local_138.m_data[1] = 0.8;
  local_128[0].m_data[0] = 1.25;
  local_128[0].m_data[1] = 1.2;
  texture::anon_unknown_0::TextureCubeShadowTestInstance::FilterCase::FilterCase
            ((FilterCase *)&local_f8,0,local_150,(Vec2 *)&local_138,local_128);
  std::
  vector<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase>_>
  ::push_back((vector<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase>_>
               *)this_01,(FilterCase *)&local_f8);
  local_138.m_data[0] = -1.19;
  local_138.m_data[1] = -1.3;
  local_128[0].m_data[0] = 1.1;
  local_128[0].m_data[1] = 1.35;
  texture::anon_unknown_0::TextureCubeShadowTestInstance::FilterCase::FilterCase
            ((FilterCase *)&local_f8,1,ref_,(Vec2 *)&local_138,local_128);
  std::
  vector<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase>_>
  ::push_back((vector<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase>_>
               *)this_01,(FilterCase *)&local_f8);
  local_138.m_data[0] = -1.2;
  local_138.m_data[1] = -1.1;
  local_128[0].m_data[0] = -0.8;
  local_128[0].m_data[1] = -0.8;
  texture::anon_unknown_0::TextureCubeShadowTestInstance::FilterCase::FilterCase
            ((FilterCase *)&local_f8,1,local_150,(Vec2 *)&local_138,local_128);
  std::
  vector<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase>_>
  ::push_back((vector<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase>_>
               *)this_01,(FilterCase *)&local_f8);
  local_138.m_data[0] = -0.61;
  local_138.m_data[1] = -0.1;
  local_128[0].m_data[0] = 0.9;
  local_128[0].m_data[1] = 1.18;
  texture::anon_unknown_0::TextureCubeShadowTestInstance::FilterCase::FilterCase
            ((FilterCase *)&local_f8,1,1.1,(Vec2 *)&local_138,local_128);
  std::
  vector<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase>_>
  ::push_back((vector<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase>_>
               *)this_01,(FilterCase *)&local_f8);
  local_138.m_data[0] = -0.75;
  local_138.m_data[1] = 1.0;
  local_128[0].m_data[0] = 0.05;
  local_128[0].m_data[1] = 0.75;
  texture::anon_unknown_0::TextureCubeShadowTestInstance::FilterCase::FilterCase
            ((FilterCase *)&local_f8,1,-0.1,(Vec2 *)&local_138,local_128);
  std::
  vector<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase>_>
  ::push_back((vector<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase>_>
               *)this_01,(FilterCase *)&local_f8);
  return pTVar1;
}

Assistant:

virtual TestInstance*				createInstance				(Context& context) const
										{
											return new INSTANCE_TYPE(context, m_testsParameters);
										}